

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O2

int SMPI_Allgatherv(void *sendbuf,int sendcount,SMPI_Datatype sendtype,void *recvbuf,
                   size_t *recvcounts,size_t *displs,SMPI_Datatype recvtype,SMPI_Comm comm)

{
  string local_28;
  
  switch(sendtype) {
  case SMPI_INT:
    switch(recvtype) {
    case SMPI_INT:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<int,int>
                ((Comm *)comm,(int *)sendbuf,(long)sendcount,(int *)recvbuf,recvcounts,displs,
                 &local_28);
      break;
    case SMPI_LONG:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<int,long>
                ((Comm *)comm,(int *)sendbuf,(long)sendcount,(long *)recvbuf,recvcounts,displs,
                 &local_28);
      break;
    case SMPI_SIZE_T:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<int,unsigned_long>
                ((Comm *)comm,(int *)sendbuf,(long)sendcount,(unsigned_long *)recvbuf,recvcounts,
                 displs,&local_28);
      break;
    case SMPI_CHAR:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<int,char>
                ((Comm *)comm,(int *)sendbuf,(long)sendcount,(char *)recvbuf,recvcounts,displs,
                 &local_28);
      break;
    case SMPI_BYTE:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<int,unsigned_char>
                ((Comm *)comm,(int *)sendbuf,(long)sendcount,(uchar *)recvbuf,recvcounts,displs,
                 &local_28);
      break;
    default:
      goto switchD_0011cfaa_default;
    }
    break;
  case SMPI_LONG:
    switch(recvtype) {
    case SMPI_INT:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<long,int>
                ((Comm *)comm,(long *)sendbuf,(long)sendcount,(int *)recvbuf,recvcounts,displs,
                 &local_28);
      break;
    case SMPI_LONG:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<long,long>
                ((Comm *)comm,(long *)sendbuf,(long)sendcount,(long *)recvbuf,recvcounts,displs,
                 &local_28);
      break;
    case SMPI_SIZE_T:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<long,unsigned_long>
                ((Comm *)comm,(long *)sendbuf,(long)sendcount,(unsigned_long *)recvbuf,recvcounts,
                 displs,&local_28);
      break;
    case SMPI_CHAR:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<long,char>
                ((Comm *)comm,(long *)sendbuf,(long)sendcount,(char *)recvbuf,recvcounts,displs,
                 &local_28);
      break;
    case SMPI_BYTE:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<long,unsigned_char>
                ((Comm *)comm,(long *)sendbuf,(long)sendcount,(uchar *)recvbuf,recvcounts,displs,
                 &local_28);
      break;
    default:
      goto switchD_0011cfaa_default;
    }
    break;
  case SMPI_SIZE_T:
    switch(recvtype) {
    case SMPI_INT:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<unsigned_long,int>
                ((Comm *)comm,(unsigned_long *)sendbuf,(long)sendcount,(int *)recvbuf,recvcounts,
                 displs,&local_28);
      break;
    case SMPI_LONG:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<unsigned_long,long>
                ((Comm *)comm,(unsigned_long *)sendbuf,(long)sendcount,(long *)recvbuf,recvcounts,
                 displs,&local_28);
      break;
    case SMPI_SIZE_T:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<unsigned_long,unsigned_long>
                ((Comm *)comm,(unsigned_long *)sendbuf,(long)sendcount,(unsigned_long *)recvbuf,
                 recvcounts,displs,&local_28);
      break;
    case SMPI_CHAR:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<unsigned_long,char>
                ((Comm *)comm,(unsigned_long *)sendbuf,(long)sendcount,(char *)recvbuf,recvcounts,
                 displs,&local_28);
      break;
    case SMPI_BYTE:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<unsigned_long,unsigned_char>
                ((Comm *)comm,(unsigned_long *)sendbuf,(long)sendcount,(uchar *)recvbuf,recvcounts,
                 displs,&local_28);
      break;
    default:
      goto switchD_0011cfaa_default;
    }
    break;
  case SMPI_CHAR:
    switch(recvtype) {
    case SMPI_INT:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<char,int>
                ((Comm *)comm,(char *)sendbuf,(long)sendcount,(int *)recvbuf,recvcounts,displs,
                 &local_28);
      break;
    case SMPI_LONG:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<char,long>
                ((Comm *)comm,(char *)sendbuf,(long)sendcount,(long *)recvbuf,recvcounts,displs,
                 &local_28);
      break;
    case SMPI_SIZE_T:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<char,unsigned_long>
                ((Comm *)comm,(char *)sendbuf,(long)sendcount,(unsigned_long *)recvbuf,recvcounts,
                 displs,&local_28);
      break;
    case SMPI_CHAR:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<char,char>
                ((Comm *)comm,(char *)sendbuf,(long)sendcount,(char *)recvbuf,recvcounts,displs,
                 &local_28);
      break;
    case SMPI_BYTE:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<char,unsigned_char>
                ((Comm *)comm,(char *)sendbuf,(long)sendcount,(uchar *)recvbuf,recvcounts,displs,
                 &local_28);
      break;
    default:
      goto switchD_0011cfaa_default;
    }
    break;
  case SMPI_BYTE:
    switch(recvtype) {
    case SMPI_INT:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<unsigned_char,int>
                ((Comm *)comm,(uchar *)sendbuf,(long)sendcount,(int *)recvbuf,recvcounts,displs,
                 &local_28);
      break;
    case SMPI_LONG:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<unsigned_char,long>
                ((Comm *)comm,(uchar *)sendbuf,(long)sendcount,(long *)recvbuf,recvcounts,displs,
                 &local_28);
      break;
    case SMPI_SIZE_T:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<unsigned_char,unsigned_long>
                ((Comm *)comm,(uchar *)sendbuf,(long)sendcount,(unsigned_long *)recvbuf,recvcounts,
                 displs,&local_28);
      break;
    case SMPI_CHAR:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<unsigned_char,char>
                ((Comm *)comm,(uchar *)sendbuf,(long)sendcount,(char *)recvbuf,recvcounts,displs,
                 &local_28);
      break;
    case SMPI_BYTE:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgatherv<unsigned_char,unsigned_char>
                ((Comm *)comm,(uchar *)sendbuf,(long)sendcount,(uchar *)recvbuf,recvcounts,displs,
                 &local_28);
      break;
    default:
      goto switchD_0011cfaa_default;
    }
    break;
  default:
    goto switchD_0011cfaa_default;
  }
  std::__cxx11::string::~string((string *)&local_28);
switchD_0011cfaa_default:
  return 0;
}

Assistant:

int SMPI_Allgatherv(const void *sendbuf, int sendcount, SMPI_Datatype sendtype, void *recvbuf,
                    const size_t *recvcounts, const size_t *displs, SMPI_Datatype recvtype,
                    SMPI_Comm comm)
{
    int ret = 0;
    switch (sendtype)
    {
#define F(type)                                                                                    \
    ret = SMPI_Allgatherv_Impl(static_cast<const type *>(sendbuf), sendcount, recvbuf, recvcounts, \
                               displs, recvtype, comm)
        CASE_FOR_EACH_TYPE(F);
#undef F
    }
    return ret;
}